

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

void __thiscall QCompleter::setFilterMode(QCompleter *this,MatchFlags filterMode)

{
  long lVar1;
  QCompletionModel *this_00;
  
  lVar1 = *(long *)&this->field_0x8;
  if ((QFlagsStorageHelper<Qt::MatchFlag,_4>)((QFlagsStorage<Qt::MatchFlag> *)(lVar1 + 0x9c))->i !=
      (QFlagsStorage<Qt::MatchFlag>)
      filterMode.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.super_QFlagsStorage<Qt::MatchFlag>.i) {
    if ((int)filterMode.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.
             super_QFlagsStorage<Qt::MatchFlag>.i - 1U < 3) {
      ((QFlagsStorageHelper<Qt::MatchFlag,_4> *)(lVar1 + 0x9c))->super_QFlagsStorage<Qt::MatchFlag>
           = (QFlagsStorage<Qt::MatchFlag>)
             filterMode.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.
             super_QFlagsStorage<Qt::MatchFlag>.i;
      QCompletionModel::createEngine(*(QCompletionModel **)(lVar1 + 0x88));
      this_00 = *(QCompletionModel **)(lVar1 + 0x88);
      QMap<QModelIndex,_QMap<QString,_QMatchData>_>::clear(&((this_00->engine).d)->cache);
      QCompletionModel::filter(this_00,&((this_00->engine).d)->curParts);
      return;
    }
    setFilterMode();
  }
  return;
}

Assistant:

void QCompleter::setFilterMode(Qt::MatchFlags filterMode)
{
    Q_D(QCompleter);

    if (d->filterMode == filterMode)
        return;

    if (Q_UNLIKELY(filterMode != Qt::MatchStartsWith &&
                   filterMode != Qt::MatchContains &&
                   filterMode != Qt::MatchEndsWith)) {
        qWarning("Unhandled QCompleter::filterMode flag is used.");
        return;
    }

    d->filterMode = filterMode;
    d->proxy->createEngine();
    d->proxy->invalidate();
}